

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tiles.cpp
# Opt level: O1

vector<sfc::Tile,_std::allocator<sfc::Tile>_> * __thiscall
sfc::Tileset::remap_tiles_for_input
          (vector<sfc::Tile,_std::allocator<sfc::Tile>_> *__return_storage_ptr__,Tileset *this,
          vector<sfc::Tile,_std::allocator<sfc::Tile>_> *tiles,Mode mode)

{
  uint uVar1;
  uint uVar2;
  pointer pTVar3;
  Tileset *pTVar4;
  uint uVar5;
  ulong uVar6;
  runtime_error *this_00;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  vector<sfc::Tile,_std::allocator<sfc::Tile>_> metatile;
  ulong local_d0;
  vector<sfc::Tile,_std::allocator<sfc::Tile>_> local_b8;
  ulong local_a0;
  Tileset *local_98;
  ulong local_90;
  Tile local_88;
  
  (__return_storage_ptr__->super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (((mode != snes) || ((this->_tile_width != 0x10 && (this->_tile_height != 0x10)))) &&
     ((1 < mode - gb || (this->_tile_height != 0x10)))) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"programmer error (remap_tiles_for_input invoked erroneously invoked)");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((this->_tiles).super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->_tiles).super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar1 = this->_tile_width;
    uVar2 = this->_tile_height;
    uVar5 = uVar1 >> 3;
    local_90 = (ulong)uVar5;
    uVar7 = uVar2 >> 3;
    local_a0 = (ulong)(uVar5 * uVar7);
    local_d0 = 0;
    local_98 = this;
    do {
      local_b8.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (7 < uVar2) {
        uVar5 = 0;
        do {
          if (7 < uVar1) {
            uVar8 = (uVar5 << ((mode == snes) << 2)) + (int)local_d0;
            uVar10 = local_90;
            do {
              uVar9 = (ulong)uVar8;
              pTVar3 = (tiles->super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar6 = ((long)(tiles->super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 3) *
                      0x2e8ba2e8ba2e8ba3;
              if (uVar9 <= uVar6 && uVar6 - uVar9 != 0) {
                std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::push_back
                          (&local_b8,pTVar3 + uVar9);
              }
              uVar8 = uVar8 + 1;
              uVar10 = uVar10 - 1;
            } while (uVar10 != 0);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar7);
      }
      pTVar4 = local_98;
      if (((long)local_b8.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_b8.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3 - local_a0 == 0) {
        Tile::Tile(&local_88,&local_b8,local_98->_no_flip,local_98->_tile_width,
                   local_98->_tile_height);
        std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::emplace_back<sfc::Tile>
                  (__return_storage_ptr__,&local_88);
        if (local_88._palette.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88._palette.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_88._palette.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88._palette.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector(&local_88._mirrors);
        if (local_88._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_88._data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88._data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::~vector(&local_b8);
      local_d0 = (ulong)((int)local_d0 + 1);
      uVar10 = ((long)(pTVar4->_tiles).super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pTVar4->_tiles).super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
    } while (local_d0 <= uVar10 && uVar10 - local_d0 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Tile> Tileset::remap_tiles_for_input(const std::vector<Tile>& tiles, Mode mode) const {
  std::vector<Tile> tv;

  if ((mode == Mode::snes && (_tile_width == 16 || _tile_height == 16))
      || ( (mode == Mode::gb || mode == Mode::gbc) && _tile_height == 16)) {
    const unsigned cells_per_tile_h = _tile_width / 8;
    const unsigned cells_per_tile_v = _tile_height / 8;

    for (unsigned i = 0; i < _tiles.size(); ++i) {
      std::vector<Tile> metatile;
      for (unsigned yo = 0; yo < cells_per_tile_v; ++yo) {
        for (unsigned xo = 0; xo < cells_per_tile_h; ++xo) {
          if ((i + (yo * (mode == Mode::snes ? 16:1)) + xo) < tiles.size())
            metatile.push_back(tiles[i + (yo * (mode == Mode::snes ? 16:1)) + xo]);
        }
      }
      if (metatile.size() == cells_per_tile_h * cells_per_tile_v)
        tv.push_back(Tile(metatile, _no_flip, _tile_width, _tile_height));
    }

  } else {
    throw std::runtime_error("programmer error (remap_tiles_for_input invoked erroneously invoked)");
  }

  return tv;
}